

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_amfcaption_utf8(flvtag_t *tag,uint32_t timestamp,utf8_char_t *text)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint32_t size;
  size_t __n;
  
  flvtag_initamf(tag,timestamp);
  sVar1 = strlen(text);
  __n = 0x10064;
  if (sVar1 < 0x10064) {
    __n = sVar1;
  }
  size = (int)__n + 0x2e;
  flvtag_reserve(tag,size);
  puVar2 = flvtag_payload_data(tag);
  puVar2[0] = '\x02';
  puVar2[1] = '\0';
  puVar2[2] = '\r';
  puVar2[3] = 'o';
  puVar2[4] = 'n';
  puVar2[5] = 'C';
  puVar2[6] = 'a';
  puVar2[7] = 'p';
  puVar2[8] = 't';
  puVar2[9] = 'i';
  puVar2[10] = 'o';
  puVar2[0xb] = 'n';
  puVar2[0xc] = 'I';
  puVar2[0xd] = 'n';
  puVar2[0xe] = 'f';
  puVar2[0xf] = 'o';
  puVar2[0x10] = '\b';
  puVar2[0x11] = '\0';
  puVar2[0x12] = '\0';
  puVar2[0x13] = '\0';
  puVar2[0x14] = '\x02';
  puVar2[0x15] = '\0';
  puVar2[0x16] = '\x04';
  puVar2[0x17] = 't';
  puVar2[0x18] = 'y';
  puVar2[0x19] = 'p';
  puVar2[0x1a] = 'e';
  puVar2[0x1b] = '\x02';
  puVar2[0x1c] = '\0';
  puVar2[0x1d] = '\x04';
  puVar2[0x1e] = 'U';
  puVar2[0x1f] = 'T';
  puVar2[0x1b] = '\x02';
  puVar2[0x1c] = '\0';
  puVar2[0x1d] = '\x04';
  puVar2[0x1e] = 'U';
  puVar2[0x1f] = 'T';
  puVar2[0x20] = 'F';
  puVar2[0x21] = '8';
  puVar2[0x22] = '\0';
  puVar2[0x23] = '\x04';
  puVar2[0x24] = 'd';
  puVar2[0x25] = 'a';
  puVar2[0x26] = 't';
  puVar2[0x27] = 'a';
  puVar2[0x28] = '\x02';
  puVar2[0x29] = '\0';
  puVar2[0x2a] = '\0';
  puVar2 = flvtag_payload_data(tag);
  memcpy(puVar2 + 0x2a,text,__n);
  *(ushort *)(puVar2 + 0x28) = (ushort)__n << 8 | (ushort)__n >> 8;
  (puVar2 + __n + 0x2a)[0] = '\0';
  (puVar2 + __n + 0x2a)[1] = '\0';
  puVar2[__n + 0x2c] = '\t';
  flvtag_updatesize(tag,size);
  return 1;
}

Assistant:

int flvtag_amfcaption_utf8(flvtag_t* tag, uint32_t timestamp, const utf8_char_t* text)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = strlen(text);

    if (MAX_AMF_STRING < size) {
        size = MAX_AMF_STRING;
    }

    flvtag_reserve(tag, sizeof(onCaptionInfoUTF8) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfoUTF8, sizeof(onCaptionInfoUTF8));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    memcpy(data, text, size);
    // Update the size of the string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfoUTF8) + size + 3);

    return 1;
}